

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O2

char * __thiscall
AccountingTestMemoryAllocator::alloc_memory
          (AccountingTestMemoryAllocator *this,size_t size,char *file,size_t line)

{
  int iVar1;
  undefined4 extraout_var;
  
  MemoryAccountant::alloc(this->accountant_,size);
  iVar1 = (*this->originalAllocator_->_vptr_TestMemoryAllocator[2])
                    (this->originalAllocator_,size,file,line);
  addMemoryToMemoryTrackingToKeepTrackOfSize(this,(char *)CONCAT44(extraout_var,iVar1),size);
  return (char *)CONCAT44(extraout_var,iVar1);
}

Assistant:

char* AccountingTestMemoryAllocator::alloc_memory(size_t size, const char* file, size_t line)
{
    accountant_.alloc(size);
    char* memory = originalAllocator_->alloc_memory(size, file, line);
    addMemoryToMemoryTrackingToKeepTrackOfSize(memory, size);
    return memory;
}